

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O3

size_t __thiscall Assimp::FBX::FBXExportProperty::size(FBXExportProperty *this)

{
  long lVar1;
  runtime_error *this_00;
  uint uVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  ulong uVar3;
  
  uVar2 = (byte)this->type - 0x43;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x27) {
    lVar1 = 1;
    if ((0x40024bUL >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x18000UL >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x4200000000U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_0033d4fb;
        lVar1 = 0xd;
      }
      else {
        lVar1 = 5;
      }
    }
    return (size_t)((this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (lVar1 - (long)(this->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
LAB_0033d4fb:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Requested size on property of unknown type","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t FBXExportProperty::size() {
    switch (type) {
        case 'C':
        case 'Y':
        case 'I':
        case 'F':
        case 'D':
        case 'L':
            return data.size() + 1;
        case 'S':
        case 'R':
            return data.size() + 5;
        case 'i':
        case 'd':
            return data.size() + 13;
        default:
            throw DeadlyExportError("Requested size on property of unknown type");
    }
}